

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode ftp_state_loggedin(connectdata *conn)

{
  CURLcode CVar1;
  ftpstate fVar2;
  
  if ((conn->ssl[0].field_0x10 & 1) == 0) {
    CVar1 = Curl_pp_sendf(&(conn->proto).ftpc.pp,"%s","PWD");
    if (CVar1 != CURLE_OK) {
      return CVar1;
    }
    fVar2 = FTP_PWD;
  }
  else {
    CVar1 = Curl_pp_sendf(&(conn->proto).ftpc.pp,"PBSZ %d",0);
    if (CVar1 != CURLE_OK) {
      return CVar1;
    }
    fVar2 = FTP_PBSZ;
  }
  (conn->proto).ftpc.state = fVar2;
  return CURLE_OK;
}

Assistant:

static CURLcode ftp_state_loggedin(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;

  if(conn->ssl[FIRSTSOCKET].use) {
    /* PBSZ = PROTECTION BUFFER SIZE.

    The 'draft-murray-auth-ftp-ssl' (draft 12, page 7) says:

    Specifically, the PROT command MUST be preceded by a PBSZ
    command and a PBSZ command MUST be preceded by a successful
    security data exchange (the TLS negotiation in this case)

    ... (and on page 8):

    Thus the PBSZ command must still be issued, but must have a
    parameter of '0' to indicate that no buffering is taking place
    and the data connection should not be encapsulated.
    */
    PPSENDF(&conn->proto.ftpc.pp, "PBSZ %d", 0);
    state(conn, FTP_PBSZ);
  }
  else {
    result = ftp_state_pwd(conn);
  }
  return result;
}